

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

HighsHashTableEntry<int,_int> *
HighsHashTree<int,_int>::find_common_recurse(NodePtr n1,NodePtr n2,int hashPos)

{
  ulong uVar1;
  ValueType *pVVar2;
  HighsHashTableEntry<int,_int> *pHVar3;
  logic_error *this;
  ulong uVar4;
  NodePtr n2_00;
  ulong *puVar5;
  long *plVar6;
  ulong *puVar7;
  
  n2_00.ptrAndType = n2.ptrAndType;
  if (((uint)n2.ptrAndType & 7) < ((uint)n1.ptrAndType & 7)) {
    n2_00.ptrAndType = n1.ptrAndType;
    n1.ptrAndType = n2.ptrAndType;
  }
  switch((uint)n1.ptrAndType & 7) {
  case 1:
    plVar6 = (long *)(n1.ptrAndType & 0xfffffffffffffff8);
    do {
      pVVar2 = find_recurse(n2_00,(ulong)*(uint *)(plVar6 + 1) * -0x7f3769c41c1b3d0d +
                                  0x9eefcacfe7301de3 >> 0x20 ^
                                  (ulong)*(uint *)(plVar6 + 1) * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,hashPos,(int *)(plVar6 + 1));
      if (pVVar2 != (ValueType *)0x0) {
        return (HighsHashTableEntry<int,_int> *)(plVar6 + 1);
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  case 0:
    pHVar3 = (HighsHashTableEntry<int,_int> *)0x0;
    break;
  case 2:
    pHVar3 = findCommonInLeaf<1>((InnerLeaf<1> *)(n1.ptrAndType & 0xfffffffffffffff8),n2_00,hashPos)
    ;
    return pHVar3;
  case 3:
    pHVar3 = findCommonInLeaf<2>((InnerLeaf<2> *)(n1.ptrAndType & 0xfffffffffffffff8),n2_00,hashPos)
    ;
    return pHVar3;
  case 4:
    pHVar3 = findCommonInLeaf<3>((InnerLeaf<3> *)(n1.ptrAndType & 0xfffffffffffffff8),n2_00,hashPos)
    ;
    return pHVar3;
  case 5:
    pHVar3 = findCommonInLeaf<4>((InnerLeaf<4> *)(n1.ptrAndType & 0xfffffffffffffff8),n2_00,hashPos)
    ;
    return pHVar3;
  case 6:
    puVar7 = (ulong *)(n1.ptrAndType & 0xfffffffffffffff8);
    puVar5 = (ulong *)(n2_00.ptrAndType & 0xfffffffffffffff8);
    uVar4 = *puVar5 & *puVar7;
    do {
      if (uVar4 == 0) {
        return (HighsHashTableEntry<int,_int> *)0x0;
      }
      uVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar4 = uVar4 ^ 1L << (uVar1 & 0x3f);
      pHVar3 = find_common_recurse((NodePtr)puVar7[POPCOUNT(*puVar7 >> ((byte)uVar1 & 0x3f))],
                                   (NodePtr)puVar5[POPCOUNT(*puVar5 >> ((byte)uVar1 & 0x3f))],
                                   hashPos + 1);
    } while (pHVar3 == (HighsHashTableEntry<int,_int> *)0x0);
    break;
  case 7:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected type in hash tree");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return pHVar3;
}

Assistant:

static const HighsHashTableEntry<K, V>* find_common_recurse(NodePtr n1,
                                                              NodePtr n2,
                                                              int hashPos) {
    if (n1.getType() > n2.getType()) std::swap(n1, n2);

    switch (n1.getType()) {
      case kEmpty:
        return nullptr;
      case kListLeaf: {
        ListLeaf* leaf = n1.getListLeaf();
        ListNode* iter = &leaf->first;
        do {
          if (find_recurse(n2, compute_hash(iter->entry.key()), hashPos,
                           iter->entry.key()))
            return &iter->entry;
          iter = iter->next;
        } while (iter != nullptr);
        return nullptr;
      }
      case kInnerLeafSizeClass1:
        return findCommonInLeaf(n1.getInnerLeafSizeClass1(), n2, hashPos);
      case kInnerLeafSizeClass2:
        return findCommonInLeaf(n1.getInnerLeafSizeClass2(), n2, hashPos);
      case kInnerLeafSizeClass3:
        return findCommonInLeaf(n1.getInnerLeafSizeClass3(), n2, hashPos);
      case kInnerLeafSizeClass4:
        return findCommonInLeaf(n1.getInnerLeafSizeClass4(), n2, hashPos);
      case kBranchNode: {
        BranchNode* branch1 = n1.getBranchNode();
        BranchNode* branch2 = n2.getBranchNode();

        uint64_t matchMask = branch1->occupation & branch2->occupation;

        while (matchMask) {
          int pos = HighsHashHelpers::log2i(matchMask);
          assert((branch1->occupation >> pos) & 1);
          assert((branch2->occupation >> pos) & 1);
          assert((matchMask >> pos) & 1);

          matchMask ^= (uint64_t{1} << pos);

          assert(((matchMask >> pos) & 1) == 0);

          int location1 =
              branch1->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;
          int location2 =
              branch2->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;

          const HighsHashTableEntry<K, V>* match =
              find_common_recurse(branch1->child[location1],
                                  branch2->child[location2], hashPos + 1);
          if (match != nullptr) return match;
        }

        return nullptr;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }